

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O3

void __thiscall PlayerA::SetSampleRate(PlayerA *this,UINT32 sampleRate)

{
  PlayerBase *pPVar1;
  uint uVar2;
  pointer ppPVar3;
  PlayerBase *pPVar4;
  ulong uVar5;
  
  this->_smplRate = sampleRate;
  ppPVar3 = (this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppPVar3) {
    uVar5 = 0;
    do {
      pPVar4 = ppPVar3[uVar5];
      pPVar1 = this->_player;
      if (pPVar4 == pPVar1) {
        uVar2 = (*pPVar1->_vptr_PlayerBase[0x19])(pPVar1);
        if ((uVar2 & 1) == 0) {
          pPVar4 = (this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar5];
          goto LAB_0011f395;
        }
      }
      else {
LAB_0011f395:
        (*pPVar4->_vptr_PlayerBase[0xf])(pPVar4,(ulong)this->_smplRate);
      }
      uVar5 = uVar5 + 1;
      ppPVar3 = (this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->_avbPlrs).
                                   super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar3 >> 3));
  }
  return;
}

Assistant:

void PlayerA::SetSampleRate(UINT32 sampleRate)
{
	_smplRate = sampleRate;
	for (size_t curPlr = 0; curPlr < _avbPlrs.size(); curPlr++)
	{
		if (_avbPlrs[curPlr] == _player && (_player->GetState() & PLAYSTATE_PLAY))
			continue;
		_avbPlrs[curPlr]->SetSampleRate(_smplRate);
	}
	return;
}